

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_graphsensing.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  ulong uVar2;
  _Base_ptr *pp_Var3;
  bool bVar4;
  pointer pcVar5;
  long lVar6;
  basic_option<char> *pbVar7;
  pointer puVar8;
  pointer puVar9;
  pointer pdVar10;
  pointer pdVar11;
  int num_rollouts_00;
  size_type sVar12;
  header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  hVar13;
  size_type sVar14;
  char cVar15;
  ostream oVar16;
  long *plVar17;
  char *pcVar18;
  typed_value<unsigned_int,_char> *ptVar19;
  typed_value<pgi::PolicyInitialization,_char> *ptVar20;
  typed_value<unsigned_long,_char> *ptVar21;
  typed_value<int,_char> *ptVar22;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar23;
  typed_value<bool,_char> *ptVar24;
  typed_value<double,_char> *ptVar25;
  const_iterator cVar26;
  any *paVar27;
  uint *puVar28;
  runtime_error *this;
  bool *pbVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  joint_vertex_t jVar31;
  ostream *poVar32;
  undefined8 *puVar33;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer pbVar34;
  long *plVar35;
  ulong *puVar36;
  ulong uVar37;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_00;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_01;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_02;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_03;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_04;
  DiscreteSpace<pgi::DiscreteObservation> *d;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_05;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_06;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_07;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_08;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_09;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_10;
  DiscreteSpace<pgi::DiscreteObservation> *d_00;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_11;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_12;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_13;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_14;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_15;
  DiscreteSpace<pgi::DiscreteAction> *extraout_RDX_16;
  DiscreteSpace<pgi::DiscreteAction> *pDVar38;
  DiscreteSpace<pgi::DiscreteObservation> *d_01;
  uint uVar39;
  int iVar40;
  size_type sVar41;
  joint_vertex_t *pjVar42;
  unsigned_long *qq;
  PolicyGraph *pPVar43;
  _Alloc_hider _Var44;
  char cVar45;
  undefined8 uVar46;
  ostream *poVar47;
  uint uVar48;
  ulong uVar49;
  string __str_2;
  int num_particles_fwd;
  long *local_19f0;
  undefined8 local_19e8;
  long local_19e0;
  undefined8 uStack_19d8;
  undefined8 local_19d0;
  int num_rollouts;
  int improvement_steps;
  double local_19c0;
  ulong *local_19b8;
  long local_19b0;
  ulong local_19a8;
  long lStack_19a0;
  double local_1998;
  basic_option<char> *local_1990;
  string __str_4;
  vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_> local_1968;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_1950;
  vector<double,_std::allocator<double>_> local_1938;
  ulong local_1918;
  string __str_6;
  PolicyInitialization policy_initialization;
  int num_particle_rollout;
  uint width;
  uint rng_seed;
  JointActionSpace jas;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_policy_graphs;
  double sy;
  double sx;
  double my;
  double mx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  local_1808;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_17d8;
  size_t blind_policy_initial_joint_action;
  uint horizon;
  JointObservationSpace jos;
  ParticleSet<pgi::GraphSensing::state_t> local_1750;
  ostringstream ss;
  joint_vertex_t *local_1700;
  joint_vertex_t local_16f8;
  undefined8 uStack_16f0;
  ios_base local_1698 [264];
  JointPolicy jp;
  ForwardPassParticle<pgi::GraphSensing::state_t> fwd;
  basic_option<char> abStack_1410 [2];
  options_description cmdline_options;
  undefined4 uStack_1304;
  long local_12f8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_12e0 [24];
  void *local_12c8;
  undefined4 local_12c0;
  undefined8 local_12b8;
  undefined4 local_12b0;
  long local_12a8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_12a0 [24];
  options_description config;
  long local_1278 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1260 [24];
  void *local_1248;
  undefined4 local_1240;
  undefined8 local_1238;
  undefined4 local_1230;
  long local_1228;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1220 [24];
  undefined1 local_1208 [24];
  StateTransitionModel t;
  RewardModel r;
  variables_map vm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1180 [8];
  _Rb_tree_node_base local_1178;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1150 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1120;
  RSSObservationModel local_10f0;
  undefined1 local_1080 [32];
  undefined1 local_1060 [24];
  pointer local_1048;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  local_1040;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_1010;
  ofstream fvalue;
  uint uStack_ff4;
  pointer pbStack_ff0;
  undefined1 local_fe8 [32];
  pointer local_fc8;
  ios_base aiStack_f00 [264];
  ofstream ftime;
  filebuf local_df0 [8];
  basic_option<char> local_de8 [2];
  ios_base aiStack_d00 [264];
  ofstream fs;
  filebuf local_bf0 [8];
  basic_option<char> local_be8 [2];
  ios_base local_b00 [264];
  PRNG rng;
  
  std::__cxx11::string::string((string *)&ftime,*argv,(allocator *)&fs);
  plVar17 = (long *)std::__cxx11::string::replace((ulong)&ftime,0,(char *)0x0,0x16d3ad);
  _fvalue = local_fe8;
  pbVar34 = (pointer)(plVar17 + 2);
  if ((pointer)*plVar17 == pbVar34) {
    local_fe8._0_8_ = (pbVar34->string_key)._M_dataplus._M_p;
    local_fe8._8_8_ = plVar17[3];
  }
  else {
    local_fe8._0_8_ = (pbVar34->string_key)._M_dataplus._M_p;
    _fvalue = (pointer)*plVar17;
  }
  local_19d0 = CONCAT44(local_19d0._4_4_,argc);
  pbStack_ff0 = (pointer)plVar17[1];
  *plVar17 = (long)pbVar34;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&fvalue);
  puVar28 = rng.engine_.x + 4;
  plVar35 = plVar17 + 2;
  if ((long *)*plVar17 == plVar35) {
    rng.engine_.x._16_8_ = *plVar35;
    rng.engine_.x._24_8_ = plVar17[3];
    rng.engine_.x._0_8_ = puVar28;
  }
  else {
    rng.engine_.x._16_8_ = *plVar35;
    rng.engine_.x._0_8_ = (long *)*plVar17;
  }
  rng.engine_.x._8_8_ = plVar17[1];
  *plVar17 = (long)plVar35;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  uVar39 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar48 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            (&config,(string *)&rng,
             (uint)boost::program_options::options_description::m_default_line_length,uVar48);
  if ((uint *)rng.engine_.x._0_8_ != puVar28) {
    operator_delete((void *)rng.engine_.x._0_8_,rng.engine_.x._16_8_ + 1);
  }
  if ((pointer)_fvalue != (pointer)local_fe8) {
    operator_delete(_fvalue,(ulong)(local_fe8._0_8_ + 1));
  }
  if (_ftime != local_de8) {
    operator_delete(_ftime,(ulong)(local_de8[0].string_key._M_dataplus._M_p + 1));
  }
  _fvalue = (pointer)boost::program_options::options_description::add_options();
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              ((char *)&fvalue,"help");
  ptVar19 = boost::program_options::value<unsigned_int>(&horizon);
  __str_1._M_dataplus._M_p._0_4_ = 3;
  ptVar19 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar19,(uint *)&__str_1);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"horizon,h",(char *)ptVar19);
  ptVar19 = boost::program_options::value<unsigned_int>(&width);
  jp.vm.super_relation_set.super_set_adaptor<_a9378c49_>.
  super_ordered_associative_container_adaptor<_4bc0be94_>.super_type.super_type.dwfb._0_4_ = 3;
  ptVar19 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar19,(uint *)&jp);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"policy-width,w",(char *)ptVar19);
  ptVar20 = boost::program_options::value<pgi::PolicyInitialization>(&policy_initialization);
  _cmdline_options = 0;
  ptVar20 = boost::program_options::typed_value<pgi::PolicyInitialization,_char>::default_value
                      (ptVar20,(PolicyInitialization *)&cmdline_options);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"policy-initialization,p",(char *)ptVar20);
  ptVar21 = boost::program_options::value<unsigned_long>(&blind_policy_initial_joint_action);
  _ftime = (basic_option<char> *)0x0;
  ptVar21 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar21,(unsigned_long *)&ftime);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"blind-action,b",(char *)ptVar21);
  ptVar22 = boost::program_options::value<int>(&improvement_steps);
  local_10f0.index_to_xy_loc_._M_t._M_impl._0_4_ = 9;
  ptVar22 = boost::program_options::typed_value<int,_char>::default_value
                      (ptVar22,(int *)&local_10f0);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"improvement-steps,i",(char *)ptVar22);
  ptVar22 = boost::program_options::value<int>(&num_rollouts);
  jas.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
       (_func_int **)CONCAT44(jas.super_IndexSpace<unsigned_long>._vptr_IndexSpace._4_4_,100);
  ptVar22 = boost::program_options::typed_value<int,_char>::default_value(ptVar22,(int *)&jas);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"num-rollouts,r",(char *)ptVar22);
  ptVar22 = boost::program_options::value<int>(&num_particle_rollout);
  jos.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
       (_func_int **)CONCAT44(jos.super_IndexSpace<unsigned_long>._vptr_IndexSpace._4_4_,100);
  ptVar22 = boost::program_options::typed_value<int,_char>::default_value(ptVar22,(int *)&jos);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"num-particles-rollout,k",(char *)ptVar22);
  ptVar22 = boost::program_options::value<int>(&num_particles_fwd);
  local_1968.
  super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1968.
                         super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1000);
  ptVar22 = boost::program_options::typed_value<int,_char>::default_value
                      (ptVar22,(int *)&local_1968);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"num-particles,n",(char *)ptVar22);
  ptVar19 = boost::program_options::value<unsigned_int>(&rng_seed);
  t.moves_.allowed_next_locations_._M_t._M_impl._0_4_ = 0x499602d2;
  ptVar19 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar19,(uint *)&t);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"seed,s",(char *)ptVar19);
  ptVar23 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  rng.engine_.x._0_8_ = puVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rng,"./","");
  ptVar23 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar23,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&rng);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"output-prefix,o",(char *)ptVar23);
  ptVar24 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  r.moves_.allowed_next_locations_._M_t._M_impl._0_1_ = 0;
  ptVar24 = boost::program_options::typed_value<bool,_char>::default_value(ptVar24,(bool *)&r);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"gaussian",(char *)ptVar24);
  ptVar25 = boost::program_options::value<double>(&mx);
  _fs = (basic_option<char> *)0x3fb999999999999a;
  ptVar25 = boost::program_options::typed_value<double,_char>::default_value(ptVar25,(double *)&fs);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"mx",(char *)ptVar25);
  ptVar25 = boost::program_options::value<double>(&my);
  fwd.m_._M_t._M_impl._0_8_ = 0x3fb999999999999a;
  ptVar25 = boost::program_options::typed_value<double,_char>::default_value(ptVar25,(double *)&fwd)
  ;
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"my",(char *)ptVar25);
  ptVar25 = boost::program_options::value<double>(&sx);
  _ss = (joint_vertex_t *)0x3fb999999999999a;
  ptVar25 = boost::program_options::typed_value<double,_char>::default_value(ptVar25,(double *)&ss);
  pcVar18 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar18,(value_semantic *)"sx",(char *)ptVar25);
  ptVar25 = boost::program_options::value<double>(&sy);
  _vm = (code *)0x3fb999999999999a;
  ptVar25 = boost::program_options::typed_value<double,_char>::default_value(ptVar25,(double *)&vm);
  boost::program_options::options_description_easy_init::operator()
            (pcVar18,(value_semantic *)"sy",(char *)ptVar25);
  if ((uint *)rng.engine_.x._0_8_ != puVar28) {
    operator_delete((void *)rng.engine_.x._0_8_,rng.engine_.x._16_8_ + 1);
  }
  boost::program_options::options_description::options_description(&cmdline_options,uVar39,uVar48);
  boost::program_options::options_description::add(&cmdline_options);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&rng,(int)local_19d0,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)&rng);
  rng.engine_.x._112_8_ = &cmdline_options;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&fvalue,(basic_command_line_parser<char> *)&rng);
  boost::program_options::store((basic_parsed_options *)&fvalue,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&fvalue);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)(rng.engine_.x + 0x14));
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(rng.engine_.x + 0xc));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rng);
  boost::program_options::notify(&vm);
  rng.engine_.x._0_8_ = puVar28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rng,"help","");
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find(local_1180,(key_type *)&rng);
  if ((uint *)rng.engine_.x._0_8_ != puVar28) {
    operator_delete((void *)rng.engine_.x._0_8_,rng.engine_.x._16_8_ + 1);
  }
  if (cVar26._M_node == &local_1178) {
    _fvalue = rng_seed;
    boost::random::
    mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
    ::seed(&rng.engine_,(uint *)&fvalue);
    jas.super_IndexSpace<unsigned_long>._vptr_IndexSpace = (_func_int **)&PTR__IndexSpace_001844f0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&jas.super_IndexSpace<unsigned_long>.num_elements_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (pgi::GraphSensing::joint_action_space + 8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&jas.super_IndexSpace<unsigned_long>.stepsize_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (pgi::GraphSensing::joint_action_space + 0x20));
    jas.super_IndexSpace<unsigned_long>.sz_ = pgi::GraphSensing::joint_action_space._56_8_;
    jas.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
         (_func_int **)&PTR__JointDiscreteSpace_001844a8;
    std::
    vector<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
    ::vector(&jas.local_,
             (vector<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
              *)(pgi::GraphSensing::joint_action_space + 0x40));
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&t,(_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)pgi::GraphSensing::allowed_moves);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&r,(_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)pgi::GraphSensing::allowed_moves);
    jos.super_IndexSpace<unsigned_long>._vptr_IndexSpace = (_func_int **)&PTR__IndexSpace_001844f0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&jos.super_IndexSpace<unsigned_long>.num_elements_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (pgi::GraphSensing::rss_joint_observation_space + 8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&jos.super_IndexSpace<unsigned_long>.stepsize_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (pgi::GraphSensing::rss_joint_observation_space + 0x20));
    jos.super_IndexSpace<unsigned_long>.sz_ = pgi::GraphSensing::rss_joint_observation_space._56_8_;
    jos.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
         (_func_int **)&PTR__JointDiscreteSpace_00184548;
    std::
    vector<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
    ::vector(&jos.local_,
             (vector<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
              *)(pgi::GraphSensing::rss_joint_observation_space + 0x40));
    std::
    _Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
    ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
                *)&local_10f0,
               (_Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
                *)pgi::GraphSensing::index_to_loc);
    local_10f0.Ptx = 18.0;
    local_10f0.Gtx = 1.5;
    local_10f0.Ltx._0_4_ = 0;
    local_10f0.Ltx._4_4_ = 0;
    local_10f0.Grx._0_4_ = 0;
    local_10f0.Grx._4_4_ = 0x3ff80000;
    local_10f0.Lrx._0_4_ = 0;
    local_10f0.Lrx._4_4_ = 0;
    local_10f0.v._0_4_ = 0;
    local_10f0.v._4_4_ = 0x41424f80;
    local_10f0.high_threshold = -110.0;
    local_10f0.low_threshold = -125.0;
    local_policy_graphs.
    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_policy_graphs.
    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_policy_graphs.
    super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (jas.local_.
        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        jas.local_.
        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar49 = 0;
      do {
        _ftime = local_de8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ftime,"horizon","");
        paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        puVar28 = boost::any_cast<unsigned_int_const&>(paVar27);
        pgi::fixed_width((PolicyGraph *)&fvalue,*puVar28,(ulong)width,
                         jas.super_IndexSpace<unsigned_long>.num_elements_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar49],
                         jos.super_IndexSpace<unsigned_long>.num_elements_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar49]);
        std::
        vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
        ::
        emplace_back<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>
                  ((vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
                    *)&local_policy_graphs,
                   (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
                    *)&fvalue);
        if (local_fc8 != (pointer)0x0) {
          operator_delete(local_fc8,0x18);
        }
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
        ::~vector((vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
                   *)(local_fe8 + 8));
        _Var44._M_p = _fvalue;
        while ((pointer)_Var44._M_p != (pointer)&fvalue) {
          pbVar34 = (pointer)(((type *)&((pointer)_Var44._M_p)->string_key)->m_edges).
                             super__List_base<boost::list_edge<unsigned_long,_unsigned_long>,_std::allocator<boost::list_edge<unsigned_long,_unsigned_long>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next;
          operator_delete(_Var44._M_p,0x28);
          _Var44._M_p = (pointer)pbVar34;
        }
        if (_ftime != local_de8) {
          operator_delete(_ftime,(ulong)(local_de8[0].string_key._M_dataplus._M_p + 1));
        }
        uVar49 = uVar49 + 1;
      } while (uVar49 < (ulong)(((long)jas.local_.
                                       super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)jas.local_.
                                       super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    if (policy_initialization == random) {
      pgi::set_random(&local_policy_graphs,&rng);
    }
    else if (policy_initialization == blind) {
      pgi::set_random(&local_policy_graphs,&rng);
      pgi::set_blind(&local_policy_graphs,blind_policy_initial_joint_action,&jas);
    }
    else if (policy_initialization == greedy) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "Greedy open loop initialization not implemented for continuous-state problems!");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgi::JointPolicy::JointPolicy(&jp,&local_policy_graphs);
    local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1968.
    super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1968.
    super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1968.
    super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    _fvalue = (pointer)local_fe8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fvalue,"gaussian","");
    paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar29 = boost::any_cast<bool_const&>(paVar27);
    bVar4 = *pbVar29;
    if ((pointer)_fvalue != (pointer)local_fe8) {
      operator_delete(_fvalue,(ulong)(local_fe8._0_8_ + 1));
    }
    if (bVar4 == false) {
      pgi::GraphSensing::sample_initial_states(&local_1968,num_particles_fwd,&rng);
    }
    else {
      _fvalue = (pointer)mx;
      pbStack_ff0 = (pointer)my;
      pgi::GraphSensing::sample_initial_states_gaussian
                (&local_1968,num_particles_fwd,(location_t *)&fvalue,sx,sy,&rng);
    }
    sVar41 = (size_type)num_particles_fwd;
    _ftime = (basic_option<char> *)pgi::JointPolicy::root(&jp);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fvalue,sVar41,
               (value_type_conflict2 *)&ftime,(allocator_type *)&fs);
    puVar9 = vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar8 = vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_fvalue;
    vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pbStack_ff0;
    vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_fe8._0_8_;
    _fvalue = (pointer)0x0;
    pbStack_ff0 = (pointer)0x0;
    local_fe8._0_8_ = (pointer)0x0;
    if (puVar8 != (pointer)0x0) {
      operator_delete(puVar8,(long)puVar9 - (long)puVar8);
    }
    if ((pointer)_fvalue != (pointer)0x0) {
      operator_delete(_fvalue,local_fe8._0_8_ - (long)_fvalue);
    }
    _ftime = (basic_option<char> *)(1.0 / (double)num_particles_fwd);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&fvalue,(long)num_particles_fwd,
               (value_type_conflict3 *)&ftime,(allocator_type *)&fs);
    pdVar11 = local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pdVar10 = local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)_fvalue;
    local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)pbStack_ff0;
    local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_fe8._0_8_;
    _fvalue = (pointer)0x0;
    pbStack_ff0 = (pointer)0x0;
    local_fe8._0_8_ = (pointer)0x0;
    if (pdVar10 != (pointer)0x0) {
      operator_delete(pdVar10,(long)pdVar11 - (long)pdVar10);
    }
    if ((pointer)_fvalue != (pointer)0x0) {
      operator_delete(_fvalue,local_fe8._0_8_ - (long)_fvalue);
    }
    _fs = local_be8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fs,"output-prefix","");
    paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
    _ftime = local_de8;
    pcVar5 = (pbVar30->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ftime,pcVar5,pcVar5 + pbVar30->_M_string_length);
    std::__cxx11::string::append((char *)&ftime);
    std::ofstream::ofstream(&fvalue,(string *)&ftime,_S_out);
    if (_ftime != local_de8) {
      operator_delete(_ftime,(ulong)(local_de8[0].string_key._M_dataplus._M_p + 1));
    }
    if (_fs != local_be8) {
      operator_delete(_fs,(ulong)(local_be8[0].string_key._M_dataplus._M_p + 1));
    }
    pp_Var3 = &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    fwd.m_._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fwd,"output-prefix","");
    paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
    pcVar5 = (pbVar30->_M_dataplus)._M_p;
    _fs = local_be8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs,pcVar5,pcVar5 + pbVar30->_M_string_length);
    std::__cxx11::string::append((char *)&fs);
    std::ofstream::ofstream(&ftime,(string *)&fs,_S_out);
    if (_fs != local_be8) {
      operator_delete(_fs,(ulong)(local_be8[0].string_key._M_dataplus._M_p + 1));
    }
    if ((_Base_ptr *)fwd.m_._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                      (ulong)((long)&(fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    iVar40 = num_rollouts;
    jVar31 = pgi::JointPolicy::root(&jp);
    local_19c0 = pgi::
                 estimate_value<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                           (iVar40,&local_1968,&local_1938,&jp,jVar31,&t,&local_10f0,&r,&jas,&jos,
                            &rng);
    poVar32 = std::ostream::_M_insert<double>(local_19c0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
    std::ostream::put((char)poVar32);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Policy value: ",0xe);
    poVar32 = std::ostream::_M_insert<double>(local_19c0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
    std::ostream::put((char)poVar32);
    std::ostream::flush();
    if (jas.local_.
        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        jas.local_.
        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_1990 = _VTT;
      local_19d0 = __M_insert<long>;
      uVar49 = 0;
      do {
        local_19f0 = &local_19e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_19f0,"output-prefix","");
        paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        pcVar5 = (pbVar30->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str_1,pcVar5,pcVar5 + pbVar30->_M_string_length);
        std::__cxx11::string::append((char *)&__str_1);
        cVar45 = '\x01';
        if (9 < uVar49) {
          uVar37 = uVar49;
          cVar15 = '\x04';
          do {
            cVar45 = cVar15;
            if (uVar37 < 100) {
              cVar45 = cVar45 + -2;
              goto LAB_0013fb56;
            }
            if (uVar37 < 1000) {
              cVar45 = cVar45 + -1;
              goto LAB_0013fb56;
            }
            if (uVar37 < 10000) goto LAB_0013fb56;
            bVar4 = 99999 < uVar37;
            uVar37 = uVar37 / 10000;
            cVar15 = cVar45 + '\x04';
          } while (bVar4);
          cVar45 = cVar45 + '\x01';
        }
LAB_0013fb56:
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_2,cVar45);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar49);
        uVar46 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar46 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar46 < __str_2._M_string_length + __str_1._M_string_length) {
          uVar46 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            uVar46 = __str_2.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar46 < __str_2._M_string_length + __str_1._M_string_length)
          goto LAB_0013fbcd;
          puVar33 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&__str_2,0,(char *)0x0,(ulong)__str_1._M_dataplus._M_p);
        }
        else {
LAB_0013fbcd:
          puVar33 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&__str_1,(ulong)__str_2._M_dataplus._M_p);
        }
        _ss = &local_16f8;
        pjVar42 = puVar33 + 2;
        if ((joint_vertex_t *)*puVar33 == pjVar42) {
          local_16f8 = *pjVar42;
          uStack_16f0 = puVar33[3];
        }
        else {
          local_16f8 = *pjVar42;
          _ss = (joint_vertex_t *)*puVar33;
        }
        local_1700 = (joint_vertex_t *)puVar33[1];
        *puVar33 = pjVar42;
        puVar33[1] = 0;
        *(undefined1 *)pjVar42 = 0;
        plVar17 = (long *)std::__cxx11::string::append((char *)&ss);
        fwd.m_._M_t._M_impl._0_8_ = &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar35 = plVar17 + 2;
        if ((long *)*plVar17 == plVar35) {
          fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar35;
          fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar17[3];
        }
        else {
          fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar35;
          fwd.m_._M_t._M_impl._0_8_ = (long *)*plVar17;
        }
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar17[1];
        *plVar17 = (long)plVar35;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::ofstream::ofstream(&fs,(string *)&fwd,_S_out);
        pDVar38 = extraout_RDX;
        if ((_Base_ptr *)fwd.m_._M_t._M_impl._0_8_ !=
            &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                          (ulong)((long)&(fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
          pDVar38 = extraout_RDX_00;
        }
        if (_ss != &local_16f8) {
          operator_delete(_ss,local_16f8 + 1);
          pDVar38 = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
          pDVar38 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
          pDVar38 = extraout_RDX_03;
        }
        if (local_19f0 != &local_19e0) {
          operator_delete(local_19f0,local_19e0 + 1);
          pDVar38 = extraout_RDX_04;
        }
        pPVar43 = jp.locals_.
                  super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar49;
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fwd,(pgi *)(jas.local_.
                                   super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar49),pDVar38);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ss,(pgi *)(jos.local_.
                                  super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar49),d);
        pgi::print((ostream *)&fs,pPVar43,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fwd,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&ss);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ss);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fwd);
        _fs = local_1990;
        *(undefined8 *)
         (&fs + (long)local_1990[-1].original_tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) = local_19d0;
        std::filebuf::~filebuf(local_bf0);
        std::ios_base::~ios_base(local_b00);
        uVar49 = uVar49 + 1;
      } while (uVar49 < (ulong)(((long)jas.local_.
                                       super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)jas.local_.
                                       super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    _ss = &local_16f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"output-prefix","");
    paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pp_Var3 = &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
    pcVar5 = (pbVar30->_M_dataplus)._M_p;
    fwd.m_._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fwd,pcVar5,pcVar5 + pbVar30->_M_string_length);
    std::__cxx11::string::append((char *)&fwd);
    std::ofstream::ofstream(&fs,(string *)&fwd,_S_out);
    if ((_Base_ptr *)fwd.m_._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                      (ulong)((long)&(fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if (_ss != &local_16f8) {
      operator_delete(_ss,local_16f8 + 1);
    }
    poVar32 = std::ostream::_M_insert<double>(local_19c0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
    std::ostream::put((char)poVar32);
    std::ostream::flush();
    pbVar7 = _VTT;
    local_1208._0_4_ = 0;
    local_1208._4_4_ = 0x3fe00000;
    local_1208[0x10] = 0;
    local_1208._8_4_ = 0x9999999a;
    local_1208._12_4_ = 0x3fa99999;
    if (0 < improvement_steps) {
      local_19d0 = __M_insert<long>;
      local_1990 = abStack_1410;
      local_1918 = 1;
      do {
        fwd.m_._M_t._M_impl._0_8_ = &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&fwd,"gaussian","");
        paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar29 = boost::any_cast<bool_const&>(paVar27);
        bVar4 = *pbVar29;
        if ((_Base_ptr *)fwd.m_._M_t._M_impl._0_8_ !=
            &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                          (ulong)((long)&(fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (bVar4 == false) {
          pgi::GraphSensing::sample_initial_states(&local_1968,num_particles_fwd,&rng);
        }
        else {
          fwd.m_._M_t._M_impl._0_8_ = mx;
          fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = my;
          pgi::GraphSensing::sample_initial_states_gaussian
                    (&local_1968,num_particles_fwd,(location_t *)&fwd,sx,sy,&rng);
        }
        sVar41 = (size_type)num_particles_fwd;
        _ss = (joint_vertex_t *)pgi::JointPolicy::root(&jp);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&fwd,sVar41,
                   (value_type_conflict2 *)&ss,(allocator_type *)&__str_1);
        puVar9 = vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar8 = vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)fwd.m_._M_t._M_impl._0_8_;
        vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        fwd.m_._M_t._M_impl._0_8_ = 0;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        if ((pointer)puVar8 != (pointer)0x0) {
          operator_delete(puVar8,(long)puVar9 - (long)puVar8);
        }
        if (fwd.m_._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                          (long)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                          fwd.m_._M_t._M_impl._0_8_);
        }
        _ss = (joint_vertex_t *)(1.0 / (double)num_particles_fwd);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&fwd,(long)num_particles_fwd,
                   (value_type_conflict3 *)&ss,(allocator_type *)&__str_1);
        pdVar11 = local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pdVar10 = local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)fwd.m_._M_t._M_impl._0_8_;
        local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        fwd.m_._M_t._M_impl._0_8_ = 0;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        if ((pointer)pdVar10 != (pointer)0x0) {
          operator_delete(pdVar10,(long)pdVar11 - (long)pdVar10);
        }
        if (fwd.m_._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                          (long)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                          fwd.m_._M_t._M_impl._0_8_);
        }
        std::chrono::_V2::system_clock::now();
        num_rollouts_00 = num_particle_rollout;
        iVar40 = num_rollouts;
        local_1080._8_8_ = (pointer)local_1060;
        boost::multi_index::
        multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
        ::multi_index_container
                  ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                    *)(local_1080 + 0x10),&jp.vm.core);
        local_1060._16_8_ = (pointer)local_1060;
        local_1048 = (pointer)local_1060;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
        ::_Rb_tree(&local_1040,&jp.stepmap._M_t);
        std::
        vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
        ::vector(&local_1010,&jp.locals_);
        pgi::backpass::
        improve_particle<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                  ((ImprovementResult *)&__str_1,(backpass *)(ulong)(uint)iVar40,num_rollouts_00,
                   (int)&local_1968,(ParticleSet<pgi::GraphSensing::state_t> *)local_1080,
                   (JointPolicy *)&t,(StateTransitionModel *)&local_10f0,(RSSObservationModel *)&r,
                   (RewardModel *)&jas,(JointActionSpace *)&jos,(JointObservationSpace *)&rng,
                   (PRNG *)local_1208,(BackPassProperties *)__str_2._M_dataplus._M_p);
        std::
        vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
        ::~vector(&local_1010);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
        ::~_Rb_tree(&local_1040);
        boost::multi_index::
        multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
        ::~multi_index_container
                  ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                    *)(local_1080 + 0x10));
        std::chrono::_V2::system_clock::now();
        poVar32 = std::ostream::_M_insert<long>((long)&ftime);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
        std::ostream::put((char)poVar32);
        std::ostream::flush();
        iVar40 = num_rollouts;
        jVar31 = pgi::JointPolicy::root((JointPolicy *)&__str_1);
        local_1998 = pgi::
                     estimate_value<pgi::GraphSensing::state_t,pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel,pgi::GraphSensing::RewardModel>
                               (iVar40,&local_1968,&local_1938,(JointPolicy *)&__str_1,jVar31,&t,
                                &local_10f0,&r,&jas,&jos,&rng);
        poVar32 = std::ostream::_M_insert<double>(local_1998);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
        std::ostream::put((char)poVar32);
        std::ostream::flush();
        if (local_19c0 < local_1998) {
          boost::multi_index::
          multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
          ::multi_index_container
                    ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                      *)&fwd,(multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                              *)&__str_1.field_2,(allocator_type *)&ss);
          sVar14 = jp.vm.core.node_count;
          hVar13 = jp.vm.core.
                   super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
          ;
          jp.vm.core.
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
          .member = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>
                     *)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = hVar13.member;
          jp.vm.core.node_count =
               (size_type)fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)sVar14;
          boost::multi_index::
          multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
          ::~multi_index_container
                    ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                      *)&fwd);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          ::operator=(&jp.stepmap._M_t,&local_1808);
          std::
          vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
          ::operator=(&jp.locals_,&local_17d8);
          if (jas.local_.
              super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              jas.local_.
              super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar49 = 0;
            do {
              local_19b8 = &local_19a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_19b8,"output-prefix","");
              paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]
                                         ((string *)&vm);
              pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
              __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
              pcVar5 = (pbVar30->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str_2,pcVar5,pcVar5 + pbVar30->_M_string_length);
              std::__cxx11::string::append((char *)&__str_2);
              cVar45 = '\x01';
              if (9 < uVar49) {
                uVar37 = uVar49;
                cVar15 = '\x04';
                do {
                  cVar45 = cVar15;
                  if (uVar37 < 100) {
                    cVar45 = cVar45 + -2;
                    goto LAB_0014058a;
                  }
                  if (uVar37 < 1000) {
                    cVar45 = cVar45 + -1;
                    goto LAB_0014058a;
                  }
                  if (uVar37 < 10000) goto LAB_0014058a;
                  bVar4 = 99999 < uVar37;
                  uVar37 = uVar37 / 10000;
                  cVar15 = cVar45 + '\x04';
                } while (bVar4);
                cVar45 = cVar45 + '\x01';
              }
LAB_0014058a:
              __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
              std::__cxx11::string::_M_construct((ulong)&__str_4,cVar45);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (__str_4._M_dataplus._M_p,(uint)__str_4._M_string_length,uVar49);
              uVar46 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                uVar46 = __str_2.field_2._M_allocated_capacity;
              }
              uVar37 = CONCAT44(__str_4._M_string_length._4_4_,(uint)__str_4._M_string_length) +
                       __str_2._M_string_length;
              if ((ulong)uVar46 < uVar37) {
                uVar46 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
                  uVar46 = __str_4.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar46 < uVar37) goto LAB_00140614;
                puVar33 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&__str_4,0,(char *)0x0,(ulong)__str_2._M_dataplus._M_p);
              }
              else {
LAB_00140614:
                puVar33 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&__str_2,(ulong)__str_4._M_dataplus._M_p);
              }
              local_19f0 = &local_19e0;
              plVar17 = puVar33 + 2;
              if ((long *)*puVar33 == plVar17) {
                local_19e0 = *plVar17;
                uStack_19d8 = puVar33[3];
              }
              else {
                local_19e0 = *plVar17;
                local_19f0 = (long *)*puVar33;
              }
              local_19e8 = puVar33[1];
              *puVar33 = plVar17;
              puVar33[1] = 0;
              *(undefined1 *)plVar17 = 0;
              puVar33 = (undefined8 *)std::__cxx11::string::append((char *)&local_19f0);
              _ss = &local_16f8;
              pjVar42 = puVar33 + 2;
              if ((joint_vertex_t *)*puVar33 == pjVar42) {
                local_16f8 = *pjVar42;
                uStack_16f0 = puVar33[3];
              }
              else {
                local_16f8 = *pjVar42;
                _ss = (joint_vertex_t *)*puVar33;
              }
              local_1700 = (joint_vertex_t *)puVar33[1];
              *puVar33 = pjVar42;
              puVar33[1] = 0;
              *(undefined1 *)(puVar33 + 2) = 0;
              std::ofstream::ofstream(&fwd,(string *)&ss,_S_out);
              pDVar38 = extraout_RDX_05;
              if (_ss != &local_16f8) {
                operator_delete(_ss,local_16f8 + 1);
                pDVar38 = extraout_RDX_06;
              }
              if (local_19f0 != &local_19e0) {
                operator_delete(local_19f0,local_19e0 + 1);
                pDVar38 = extraout_RDX_07;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
                operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
                pDVar38 = extraout_RDX_08;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
                pDVar38 = extraout_RDX_09;
              }
              if (local_19b8 != &local_19a8) {
                operator_delete(local_19b8,local_19a8 + 1);
                pDVar38 = extraout_RDX_10;
              }
              pPVar43 = jp.locals_.
                        super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar49;
              pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ss,(pgi *)(jas.local_.
                                        super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar49),pDVar38)
              ;
              pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_19f0,
                         (pgi *)(jos.local_.
                                 super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar49),d_00);
              pgi::print((ostream *)&fwd,pPVar43,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ss,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_19f0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_19f0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&ss);
              fwd.m_._M_t._M_impl._0_8_ = pbVar7;
              *(undefined8 *)
               (&fwd.m_._M_t._M_impl.field_0x0 +
               (long)&((pbVar7[-1].original_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p) = local_19d0
              ;
              std::filebuf::~filebuf((filebuf *)&fwd.m_._M_t._M_impl.super__Rb_tree_header);
              std::ios_base::~ios_base((ios_base *)local_1990);
              uVar49 = uVar49 + 1;
            } while (uVar49 < (ulong)(((long)jas.local_.
                                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)jas.local_.
                                             super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          local_19f0 = &local_19e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_19f0,"output-prefix","");
          paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm)
          ;
          pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
          _ss = &local_16f8;
          pcVar5 = (pbVar30->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ss,pcVar5,pcVar5 + pbVar30->_M_string_length);
          std::__cxx11::string::append((char *)&ss);
          std::ofstream::ofstream(&fwd,(string *)&ss,_S_out);
          if (_ss != &local_16f8) {
            operator_delete(_ss,local_16f8 + 1);
          }
          if (local_19f0 != &local_19e0) {
            operator_delete(local_19f0,local_19e0 + 1);
          }
          poVar32 = std::ostream::_M_insert<double>(local_1998);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
          std::ostream::put((char)poVar32);
          std::ostream::flush();
          fwd.m_._M_t._M_impl._0_8_ = pbVar7;
          *(undefined8 *)
           (&fwd.m_._M_t._M_impl.field_0x0 +
           (long)&((pbVar7[-1].original_tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p) = local_19d0;
          std::filebuf::~filebuf((filebuf *)&fwd.m_._M_t._M_impl.super__Rb_tree_header);
          std::ios_base::~ios_base((ios_base *)local_1990);
          local_19c0 = local_1998;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Step ",5);
        poVar32 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_1918);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32," of ",4);
        poVar32 = (ostream *)std::ostream::operator<<(poVar32,improvement_steps);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32,": ",2);
        poVar32 = std::ostream::_M_insert<double>(local_1998);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32," (best: ",8);
        poVar32 = std::ostream::_M_insert<double>(local_19c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32,", ",2);
        poVar32 = std::ostream::_M_insert<long>((long)poVar32);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32," microseconds",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar32 + -0x18) + (char)poVar32);
        std::ostream::put((char)poVar32);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        fwd.m_._M_t._M_impl._0_8_ = &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&fwd,"output-prefix","");
        paVar27 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar30 = boost::any_cast<std::__cxx11::string_const&>(paVar27);
        poVar32 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&ss,(pbVar30->_M_dataplus)._M_p,pbVar30->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32,"/step",5);
        lVar6 = *(long *)poVar32;
        *(undefined8 *)(poVar32 + *(long *)(lVar6 + -0x18) + 0x10) = 3;
        lVar6 = *(long *)(lVar6 + -0x18);
        poVar47 = poVar32 + lVar6;
        if (poVar32[lVar6 + 0xe1] == (ostream)0x0) {
          oVar16 = (ostream)std::ios::widen((char)poVar47);
          poVar47[0xe0] = oVar16;
          poVar47[0xe1] = (ostream)0x1;
        }
        poVar47[0xe0] = (ostream)0x30;
        poVar32 = (ostream *)std::ostream::operator<<(poVar32,(int)local_1918);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32,"_",1);
        if ((_Base_ptr *)fwd.m_._M_t._M_impl._0_8_ !=
            &fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)fwd.m_._M_t._M_impl._0_8_,
                          (ulong)((long)&(fwd.m_._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (jas.local_.
            super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            jas.local_.
            super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar49 = 0;
          do {
            std::__cxx11::stringbuf::str();
            plVar17 = (long *)std::__cxx11::string::append((char *)&__str_4);
            local_19b8 = &local_19a8;
            puVar36 = (ulong *)(plVar17 + 2);
            if ((ulong *)*plVar17 == puVar36) {
              local_19a8 = *puVar36;
              lStack_19a0 = plVar17[3];
            }
            else {
              local_19a8 = *puVar36;
              local_19b8 = (ulong *)*plVar17;
            }
            local_19b0 = plVar17[1];
            *plVar17 = (long)puVar36;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            cVar45 = '\x01';
            if (9 < uVar49) {
              uVar37 = uVar49;
              cVar15 = '\x04';
              do {
                cVar45 = cVar15;
                if (uVar37 < 100) {
                  cVar45 = cVar45 + -2;
                  goto LAB_00140cc1;
                }
                if (uVar37 < 1000) {
                  cVar45 = cVar45 + -1;
                  goto LAB_00140cc1;
                }
                if (uVar37 < 10000) goto LAB_00140cc1;
                bVar4 = 99999 < uVar37;
                uVar37 = uVar37 / 10000;
                cVar15 = cVar45 + '\x04';
              } while (bVar4);
              cVar45 = cVar45 + '\x01';
            }
LAB_00140cc1:
            __str_6._M_dataplus._M_p = (pointer)&__str_6.field_2;
            std::__cxx11::string::_M_construct((ulong)&__str_6,cVar45);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (__str_6._M_dataplus._M_p,(uint)__str_6._M_string_length,uVar49);
            uVar37 = 0xf;
            if (local_19b8 != &local_19a8) {
              uVar37 = local_19a8;
            }
            uVar2 = CONCAT44(__str_6._M_string_length._4_4_,(uint)__str_6._M_string_length) +
                    local_19b0;
            if (uVar37 < uVar2) {
              uVar46 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_6._M_dataplus._M_p != &__str_6.field_2) {
                uVar46 = __str_6.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar46 < uVar2) goto LAB_00140d4c;
              puVar33 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&__str_6,0,(char *)0x0,(ulong)local_19b8);
            }
            else {
LAB_00140d4c:
              puVar33 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_19b8,(ulong)__str_6._M_dataplus._M_p);
            }
            __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
            psVar1 = puVar33 + 2;
            if ((size_type *)*puVar33 == psVar1) {
              __str_2.field_2._M_allocated_capacity = *psVar1;
              __str_2.field_2._8_8_ = puVar33[3];
            }
            else {
              __str_2.field_2._M_allocated_capacity = *psVar1;
              __str_2._M_dataplus._M_p = (pointer)*puVar33;
            }
            __str_2._M_string_length = puVar33[1];
            *puVar33 = psVar1;
            puVar33[1] = 0;
            *(char *)psVar1 = '\0';
            puVar33 = (undefined8 *)std::__cxx11::string::append((char *)&__str_2);
            local_19f0 = &local_19e0;
            plVar17 = puVar33 + 2;
            if ((long *)*puVar33 == plVar17) {
              local_19e0 = *plVar17;
              uStack_19d8 = puVar33[3];
            }
            else {
              local_19e0 = *plVar17;
              local_19f0 = (long *)*puVar33;
            }
            local_19e8 = puVar33[1];
            *puVar33 = plVar17;
            puVar33[1] = 0;
            *(undefined1 *)(puVar33 + 2) = 0;
            std::ofstream::ofstream(&fwd,(string *)&local_19f0,_S_out);
            pDVar38 = extraout_RDX_11;
            if (local_19f0 != &local_19e0) {
              operator_delete(local_19f0,local_19e0 + 1);
              pDVar38 = extraout_RDX_12;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
              pDVar38 = extraout_RDX_13;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_6._M_dataplus._M_p != &__str_6.field_2) {
              operator_delete(__str_6._M_dataplus._M_p,__str_6.field_2._M_allocated_capacity + 1);
              pDVar38 = extraout_RDX_14;
            }
            if (local_19b8 != &local_19a8) {
              operator_delete(local_19b8,local_19a8 + 1);
              pDVar38 = extraout_RDX_15;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
              operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
              pDVar38 = extraout_RDX_16;
            }
            pPVar43 = local_17d8.
                      super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar49;
            pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_19f0,
                       (pgi *)(jas.local_.
                               super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar49),pDVar38);
            pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__str_2,
                       (pgi *)(jos.local_.
                               super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar49),d_01);
            pgi::print((ostream *)&fwd,pPVar43,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_19f0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__str_2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__str_2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_19f0);
            fwd.m_._M_t._M_impl._0_8_ = pbVar7;
            *(undefined8 *)
             (&fwd.m_._M_t._M_impl.field_0x0 +
             (long)&((pbVar7[-1].original_tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p) = local_19d0;
            std::filebuf::~filebuf((filebuf *)&fwd.m_._M_t._M_impl.super__Rb_tree_header);
            std::ios_base::~ios_base((ios_base *)local_1990);
            uVar49 = uVar49 + 1;
          } while (uVar49 < (ulong)(((long)jas.local_.
                                           super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)jas.local_.
                                           super__Vector_base<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::ios_base::~ios_base(local_1698);
        std::
        vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
        ::~vector(&local_17d8);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
        ::~_Rb_tree(&local_1808);
        boost::multi_index::
        multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
        ::~multi_index_container
                  ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                    *)&__str_1.field_2);
        iVar40 = (int)local_1918;
        local_1918 = (ulong)(iVar40 + 1);
      } while (iVar40 < improvement_steps);
    }
    std::vector<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>::vector
              (&local_1750.states_,&local_1968);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_1750.nodes_,&vStack_1950);
    std::vector<double,_std::allocator<double>_>::vector(&local_1750.weights_,&local_1938);
    pgi::ForwardPassParticle<pgi::GraphSensing::state_t>::
    ForwardPassParticle<pgi::GraphSensing::StateTransitionModel,pgi::GraphSensing::RSSObservationModel>
              (&fwd,&local_1750,&jp,&t,&local_10f0,&jas,&jos,&rng);
    if (local_1750.weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1750.weights_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1750.weights_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1750.weights_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1750.nodes_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1750.nodes_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1750.nodes_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1750.nodes_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1750.states_.
        super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1750.states_.
                      super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1750.states_.
                            super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1750.states_.
                            super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Forward pass results: \n",0x17);
    uVar39 = 1;
    while (uVar48 = pgi::JointPolicy::max_steps(&jp), uVar39 <= uVar48) {
      local_19d0 = CONCAT44(local_19d0._4_4_,uVar39);
      pgi::JointPolicy::joint_vertices_with_steps_remaining
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ss,&jp,uVar39);
      for (pjVar42 = _ss; pjVar42 != local_1700; pjVar42 = pjVar42 + 1) {
        __x = pgi::JointPolicy::to_local(&jp,*pjVar42);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__str_1,__x);
        sVar12 = __str_1._M_string_length;
        for (_Var44 = __str_1._M_dataplus; _Var44._M_p != (pointer)sVar12;
            _Var44._M_p = _Var44._M_p + 8) {
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar32," ",1);
        }
        local_19f0 = (long *)*pjVar42;
        std::
        map<unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>_>
        ::at(&fwd.m_,(key_type_conflict *)&local_19f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
        poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar32," particles\n",0xb);
        if (__str_1._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(__str_1._M_dataplus._M_p,
                          __str_1.field_2._M_allocated_capacity - (long)__str_1._M_dataplus._M_p);
        }
      }
      if (_ss != (joint_vertex_t *)0x0) {
        operator_delete(_ss,local_16f8 - (long)_ss);
      }
      uVar39 = (int)local_19d0 + 1;
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>,_std::_Select1st<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>,_std::_Select1st<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pgi::ParticleSet<pgi::GraphSensing::state_t>_>_>_>
                 *)&fwd);
    uVar46 = __M_insert<long>;
    pbVar7 = _VTT;
    _fs = _VTT;
    *(undefined8 *)
     (&fs + (long)_VTT[-1].original_tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) = __M_insert<long>;
    std::filebuf::~filebuf(local_bf0);
    std::ios_base::~ios_base(local_b00);
    _ftime = pbVar7;
    *(undefined8 *)
     (&ftime + (long)pbVar7[-1].original_tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) = uVar46;
    std::filebuf::~filebuf(local_df0);
    std::ios_base::~ios_base(aiStack_d00);
    _fvalue = (pointer)pbVar7;
    *(undefined8 *)
     (&fvalue +
     (long)pbVar7[-1].original_tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) = uVar46;
    std::filebuf::~filebuf((filebuf *)&pbStack_ff0);
    std::ios_base::~ios_base(aiStack_f00);
    if ((pointer)local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1938.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_1950.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_1950.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_1950.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1968.
        super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1968.
                      super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1968.
                            super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1968.
                            super__Vector_base<pgi::GraphSensing::state_t,_std::allocator<pgi::GraphSensing::state_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ::~vector(&jp.locals_);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::~_Rb_tree(&jp.stepmap._M_t);
    boost::multi_index::
    multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
    ::~multi_index_container(&jp.vm.core);
    std::
    vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
    ::~vector(&local_policy_graphs);
    std::
    _Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pgi::GraphSensing::location_t>,_std::_Select1st<std::pair<const_int,_pgi::GraphSensing::location_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pgi::GraphSensing::location_t>_>_>
                 *)&local_10f0);
    jos.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
         (_func_int **)&PTR__JointDiscreteSpace_00184548;
    std::
    vector<pgi::DiscreteSpace<pgi::DiscreteObservation>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteObservation>_>_>
    ::~vector(&jos.local_);
    pgi::IndexSpace<unsigned_long>::~IndexSpace(&jos.super_IndexSpace<unsigned_long>);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&r);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&t);
    jas.super_IndexSpace<unsigned_long>._vptr_IndexSpace =
         (_func_int **)&PTR__JointDiscreteSpace_001844a8;
    std::
    vector<pgi::DiscreteSpace<pgi::DiscreteAction>,_std::allocator<pgi::DiscreteSpace<pgi::DiscreteAction>_>_>
    ::~vector(&jas.local_);
    pgi::IndexSpace<unsigned_long>::~IndexSpace(&jas.super_IndexSpace<unsigned_long>);
    iVar40 = 0;
  }
  else {
    plVar17 = (long *)boost::program_options::operator<<((ostream *)&std::cout,&config);
    std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
    std::ostream::put((char)plVar17);
    iVar40 = 1;
    std::ostream::flush();
  }
  _vm = std::__cxx11::stringbuf::str;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1120);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_1150);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_1180);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_12a0);
  if (local_12c8 != (void *)0x0) {
    operator_delete(local_12c8,local_12a8 - (long)local_12c8);
    local_12c8 = (void *)0x0;
    local_12c0 = 0;
    local_12b8 = 0;
    local_12b0 = 0;
    local_12a8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_12e0);
  if ((long *)CONCAT44(uStack_1304,_cmdline_options) != local_12f8) {
    operator_delete((long *)CONCAT44(uStack_1304,_cmdline_options),local_12f8[0] + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1220);
  if (local_1248 != (void *)0x0) {
    operator_delete(local_1248,local_1228 - (long)local_1248);
    local_1248 = (void *)0x0;
    local_1240 = 0;
    local_1238 = 0;
    local_1230 = 0;
    local_1228 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_1260);
  if (_config != local_1278) {
    operator_delete(_config,local_1278[0] + 1);
  }
  return iVar40;
}

Assistant:

int main(int argc, char** argv) {
  unsigned int rng_seed;
  unsigned int horizon;
  unsigned int width;
  int improvement_steps;
  int num_particles_fwd;
  int num_rollouts;
  int num_particle_rollout;
  std::size_t blind_policy_initial_joint_action;
  pgi::PolicyInitialization policy_initialization;

  double mx, my, sx, sy;  // optional gaussian initial belief params

  namespace po = boost::program_options;
  po::options_description config("NPGI planner for (Dec)POMDPs \nUsage: " +
                                 std::string(argv[0]) +
                                 " [OPTION]...\nOptions");
  config.add_options()("help", "produce help message")(
      "horizon,h", po::value<unsigned int>(&horizon)->default_value(3),
      "problem horizon")("policy-width,w",
                         po::value<unsigned int>(&width)->default_value(3),
                         "policy width")(
      "policy-initialization,p",
      po::value<pgi::PolicyInitialization>(&policy_initialization)
          ->default_value(pgi::PolicyInitialization::random),
      "policy initialization type: (random | greedy | blind)")(
      "blind-action,b",
      po::value<std::size_t>(&blind_policy_initial_joint_action)
          ->default_value(0),
      "action for blind policy initialization")(
      "improvement-steps,i",
      po::value<int>(&improvement_steps)->default_value(9),
      "number of policy improvement steps")(
      "num-rollouts,r",
      po::value<int>(&num_rollouts)->default_value(100),
      "number of rollouts for value estimation")
      (
      "num-particles-rollout,k", po::value<int>(&num_particle_rollout)->default_value(100),
      "number of particles per rollout")(
      "num-particles,n", po::value<int>(&num_particles_fwd)->default_value(1000),
      "number of particles in P(s,q) forward pass")(
      "seed,s", po::value<unsigned int>(&rng_seed)->default_value(1234567890),
      "random number seed")(
      "output-prefix,o", po::value<std::string>()->default_value("./"),
      "output prefix")("gaussian", po::bool_switch()->default_value(false),
                       "toggle for Gaussian initial belief")(
      "mx", po::value<double>(&mx)->default_value(0.1),
      "initial belief mean x value")("my",
                                     po::value<double>(&my)->default_value(0.1),
                                     "initial belief mean y value")(
      "sx", po::value<double>(&sx)->default_value(0.1),
      "initial belief x value standard deviation")(
      "sy", po::value<double>(&sy)->default_value(0.1),
      "initial belief y value standard deviation");

  po::options_description cmdline_options;
  cmdline_options.add(config);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv).options(cmdline_options).run(),
            vm);
  po::notify(vm);
  if (vm.count("help")) {
    std::cout << config << std::endl;
    return 1;
  }

  pgi::PRNG rng(rng_seed);

  // Create the GraphSensing Dec-POMDP problem
  pgi::JointActionSpace jas = pgi::GraphSensing::joint_action_space;
  pgi::GraphSensing::StateTransitionModel t;
  pgi::GraphSensing::RewardModel r;

  // RSS
  pgi::JointObservationSpace jos =
      pgi::GraphSensing::rss_joint_observation_space;
  pgi::GraphSensing::RSSObservationModel o;

  // Initialize policy
  std::vector<pgi::PolicyGraph> local_policy_graphs;
  for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
    local_policy_graphs.emplace_back(pgi::fixed_width(
        vm["horizon"].as<unsigned int>(), width, jas.num_local_indices(agent),
        jos.num_local_indices(agent)));
  }

  if (policy_initialization == pgi::PolicyInitialization::random) {
    pgi::set_random(local_policy_graphs, rng);
  } else if (policy_initialization == pgi::PolicyInitialization::greedy) {
    throw std::runtime_error(
        "Greedy open loop initialization not implemented for continuous-state "
        "problems!");
  } else if (policy_initialization == pgi::PolicyInitialization::blind) {
    pgi::set_random(local_policy_graphs,
                    rng);  // to randomize the edges in the policy
    pgi::set_blind(local_policy_graphs, blind_policy_initial_joint_action, jas);
  }
  pgi::JointPolicy jp(local_policy_graphs);

  // Create initial belief
  pgi::ParticleSet<pgi::GraphSensing::state_t> init_particles;
  if (vm["gaussian"].as<bool>()) {
    pgi::GraphSensing::sample_initial_states_gaussian(
        init_particles.states_, num_particles_fwd,
        pgi::GraphSensing::location_t{mx, my}, sx, sy, rng);
  } else {
    pgi::GraphSensing::sample_initial_states(init_particles.states_,
                                             num_particles_fwd, rng);
  }
  init_particles.nodes_ =
      std::vector<pgi::JointPolicy::joint_vertex_t>(num_particles_fwd, jp.root());
  init_particles.weights_ = std::vector<double>(
      num_particles_fwd, 1.0 / static_cast<double>(num_particles_fwd));

  // Set up output streams
  std::ofstream fvalue(vm["output-prefix"].as<std::string>() +
                       "policy_values.txt");
  std::ofstream ftime(vm["output-prefix"].as<std::string>() +
                      "duration_microseconds.txt");

  // Get value of initial policy
  double best_value = estimate_value(num_rollouts, init_particles.states_,
                                     init_particles.weights_, jp, jp.root(), t,
                                     o, r, jas, jos, rng);

  fvalue << best_value << std::endl;
  std::cout << "Policy value: " << best_value << std::endl;

  // write initial best policy and value
  for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
    std::ofstream fs(vm["output-prefix"].as<std::string>() +
                     "best_policy_agent" + std::to_string(agent) + ".dot");
    print(fs, jp.local_policy(agent), pgi::element_names(jas.get(agent)),
          pgi::element_names(jos.get(agent)));
  }

  std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
  fs << best_value << std::endl;

  // Backward pass setup
  pgi::backpass::BackPassProperties props;
  props.prob_random_history_in_heuristic_improvement = 0.05;

  for (int i = 1; i <= improvement_steps; ++i) {

    // sample new set of particles for improvement
    if (vm["gaussian"].as<bool>()) {
      pgi::GraphSensing::sample_initial_states_gaussian(
          init_particles.states_, num_particles_fwd,
          pgi::GraphSensing::location_t{mx, my}, sx, sy, rng);
    } else {
      pgi::GraphSensing::sample_initial_states(init_particles.states_,
                                               num_particles_fwd, rng);
    }
    init_particles.nodes_ =
        std::vector<pgi::JointPolicy::joint_vertex_t>(num_particles_fwd, jp.root());
    init_particles.weights_ = std::vector<double>(
        num_particles_fwd, 1.0 / static_cast<double>(num_particles_fwd));

    std::chrono::high_resolution_clock::time_point t1 =
        std::chrono::high_resolution_clock::now();
    auto bp = pgi::backpass::improve_particle(num_rollouts, num_particle_rollout, init_particles, jp, t, o, r, jas,
                                              jos, rng, props);
    std::chrono::high_resolution_clock::time_point t3 =
        std::chrono::high_resolution_clock::now();
    auto duration =
        std::chrono::duration_cast<std::chrono::microseconds>(t3 - t1).count();
    ftime << duration << std::endl;

    // check
    double improved_policy_value = estimate_value(
        num_rollouts, init_particles.states_, init_particles.weights_, bp.improved_policy,
        bp.improved_policy.root(), t, o, r, jas, jos, rng);

    fvalue << improved_policy_value << std::endl;

    if (improved_policy_value > best_value) {
      best_value = improved_policy_value;
      jp = bp.improved_policy;

      // Update best value and policy!
      for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
        std::ofstream fs(vm["output-prefix"].as<std::string>() +
                         "best_policy_agent" + std::to_string(agent) + ".dot");
        print(fs, jp.local_policy(agent), pgi::element_names(jas.get(agent)),
              pgi::element_names(jos.get(agent)));
      }

      std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
      fs << best_value << std::endl;
    }

    std::cout << "Step " << i << " of " << improvement_steps << ": "
              << improved_policy_value << " (best: " << best_value << ")"
              << ", " << duration << " microseconds" << std::endl;

    std::ostringstream ss;
    ss << vm["output-prefix"].as<std::string>() << "/step" << std::setw(3)
       << std::setfill('0') << i << "_";

    for (std::size_t agent = 0; agent < jas.num_local_spaces(); ++agent) {
      std::ofstream fs(ss.str() + "agent" + std::to_string(agent) + ".dot");
      print(fs, bp.improved_policy.local_policy(agent),
            pgi::element_names(jas.get(agent)),
            pgi::element_names(jos.get(agent)));
    }
  }

  pgi::ForwardPassParticle<pgi::GraphSensing::state_t> fwd(init_particles, jp,
                                                           t, o, jas, jos, rng);
  std::cout << "Forward pass results: \n";
  for (unsigned int s = 1; s <= jp.max_steps(); ++s) {
  for (auto& q : jp.joint_vertices_with_steps_remaining(s))
  {
    auto ql = jp.to_local(q);
    for (auto& qq : ql)
      std::cout << qq << " ";

    const pgi::ParticleSet<pgi::GraphSensing::state_t>& p = fwd.particles_at(q);
    std::cout << ": " << p.weights_.size() << " particles\n";

  }
  }

  return 0;
}